

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameconfigfile.cpp
# Opt level: O0

void __thiscall FGameConfigFile::AddAutoexec(FGameConfigFile *this,DArgs *list,char *game)

{
  bool bVar1;
  int iVar2;
  char *filename;
  FString local_98 [3];
  FString local_80;
  FString expanded_path;
  char *value;
  char *key;
  char section [64];
  char *game_local;
  DArgs *list_local;
  FGameConfigFile *this_local;
  
  mysnprintf((char *)&key,0x40,"%s.AutoExec",game);
  CreateStandardAutoExec(this,(char *)&key,false);
  bVar1 = FConfigFile::SectionIsEmpty(&this->super_FConfigFile);
  if (!bVar1) {
    while (bVar1 = FConfigFile::NextInSection(&this->super_FConfigFile,&value,&expanded_path.Chars),
          bVar1) {
      iVar2 = strcasecmp(value,"Path");
      if ((iVar2 == 0) && (*expanded_path.Chars != '\0')) {
        ExpandEnvVars((char *)&local_80);
        filename = FString::operator_cast_to_char_(&local_80);
        bVar1 = FileExists(filename);
        if (bVar1) {
          ExpandEnvVars((char *)local_98);
          DArgs::AppendArg(list,local_98);
          FString::~FString(local_98);
        }
        FString::~FString(&local_80);
      }
    }
  }
  return;
}

Assistant:

void FGameConfigFile::AddAutoexec (DArgs *list, const char *game)
{
	char section[64];
	const char *key;
	const char *value;

	mysnprintf (section, countof(section), "%s.AutoExec", game);

	// If <game>.AutoExec section does not exist, create it
	// with a default autoexec.cfg file present.
	CreateStandardAutoExec(section, false);
	// Run any files listed in the <game>.AutoExec section
	if (!SectionIsEmpty())
	{
		while (NextInSection (key, value))
		{
			if (stricmp (key, "Path") == 0 && *value != '\0')
			{
				FString expanded_path = ExpandEnvVars(value);
				if (FileExists(expanded_path))
				{
					list->AppendArg (ExpandEnvVars(value));
				}
			}
		}
	}
}